

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::EndColumns(void)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  ImU32 col;
  int i;
  uint idx;
  int column_index;
  ImGuiContext *g;
  uint uVar7;
  float fVar8;
  float fVar9;
  undefined4 extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  bool held;
  bool hovered;
  ImGuiID column_id;
  undefined1 local_88 [16];
  ulong local_78;
  float local_70;
  float local_6c;
  ImVec2 local_68;
  ImVec2 local_60;
  ImRect column_rect;
  
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->Accessed = true;
  if ((pIVar2->DC).ColumnsCount < 2) {
    __assert_fail("window->DC.ColumnsCount > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.cpp"
                  ,0x27e3,"void ImGui::EndColumns()");
  }
  PopItemWidth();
  PopClipRect();
  ImDrawList::ChannelsMerge(pIVar2->DrawList);
  fVar8 = (pIVar2->DC).ColumnsCellMaxY;
  fVar9 = (pIVar2->DC).CursorPos.y;
  fVar1 = (pIVar2->DC).ColumnsMaxX;
  uVar7 = -(uint)(fVar9 <= fVar8);
  fVar9 = (float)(~uVar7 & (uint)fVar9 | (uint)fVar8 & uVar7);
  (pIVar2->DC).ColumnsCellMaxY = fVar9;
  (pIVar2->DC).CursorPos.y = fVar9;
  fVar8 = (pIVar2->DC).ColumnsStartMaxPosX;
  uVar7 = -(uint)(fVar1 <= fVar8);
  (pIVar2->DC).CursorMaxPos.x = (float)(~uVar7 & (uint)fVar1 | (uint)fVar8 & uVar7);
  if ((((pIVar2->DC).ColumnsFlags & 1) == 0) && (pIVar2->SkipItems == false)) {
    local_6c = (pIVar2->DC).ColumnsStartPosY;
    local_70 = local_6c + 1.0;
    local_78 = 0xffffffffffffffff;
    for (uVar7 = 1; pIVar5 = GImGui, (int)uVar7 < (pIVar2->DC).ColumnsCount; uVar7 = uVar7 + 1) {
      local_88._0_4_ = (pIVar2->Pos).x;
      fVar8 = GetColumnOffset(uVar7);
      local_88._0_4_ = fVar8 + (float)local_88._0_4_;
      column_id = (pIVar2->DC).ColumnsSetId + uVar7;
      column_rect.Min.x = (float)local_88._0_4_ + -4.0;
      local_88._4_4_ = extraout_XMM0_Db;
      local_88._8_4_ = extraout_XMM0_Dc;
      local_88._12_4_ = extraout_XMM0_Dd;
      column_rect.Max.x = (float)local_88._0_4_ + 4.0;
      column_rect.Min.y = local_6c;
      column_rect.Max.y = fVar9;
      bVar6 = IsClippedEx(&column_rect,&column_id,false);
      if (!bVar6) {
        hovered = false;
        held = false;
        if (((pIVar2->DC).ColumnsFlags & 2) == 0) {
          ButtonBehavior(&column_rect,column_id,&hovered,&held,0);
          if (hovered == false) {
            if ((held & 1U) != 0) {
              pIVar4->MouseCursor = 4;
              goto LAB_00157551;
            }
          }
          else {
            pIVar4->MouseCursor = 4;
            if ((held & 1U) != 0) {
LAB_00157551:
              if (pIVar4->ActiveIdIsJustActivated == true) {
                (pIVar4->ActiveIdClickOffset).x = (pIVar4->ActiveIdClickOffset).x + -4.0;
              }
              local_78 = (ulong)uVar7;
            }
          }
        }
        idx = hovered | 0x1c;
        if ((held & 1U) != 0) {
          idx = 0x1e;
        }
        col = GetColorU32(idx,1.0);
        local_68.x = (float)(int)(float)local_88._0_4_;
        local_60.y = local_70;
        local_68.y = fVar9;
        local_60.x = local_68.x;
        ImDrawList::AddLine(pIVar2->DrawList,&local_60,&local_68,col,1.0);
      }
    }
    column_index = (int)local_78;
    if (column_index != -1) {
      if (column_index < 1) {
        __assert_fail("column_index > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.cpp"
                      ,0x2753,"float GetDraggedColumnOffset(int)");
      }
      pIVar3 = GImGui->CurrentWindow;
      if (GImGui->ActiveId != (pIVar3->DC).ColumnsSetId + column_index) {
        __assert_fail("g.ActiveId == window->DC.ColumnsSetId + ImGuiID(column_index)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.cpp"
                      ,0x2754,"float GetDraggedColumnOffset(int)");
      }
      local_88 = ZEXT416((uint)(((GImGui->IO).MousePos.x - (GImGui->ActiveIdClickOffset).x) -
                               (pIVar3->Pos).x));
      fVar8 = GetColumnOffset(column_index + -1);
      fVar8 = fVar8 + (pIVar5->Style).ColumnsMinSpacing;
      uVar7 = -(uint)(fVar8 <= (float)local_88._0_4_);
      fVar8 = (float)(~uVar7 & (uint)fVar8 | local_88._0_4_ & uVar7);
      if (((pIVar3->DC).ColumnsFlags & 4) != 0) {
        local_88._4_4_ = local_88._4_4_ & extraout_XMM0_Db_00;
        local_88._0_4_ = fVar8;
        local_88._8_4_ = local_88._8_4_ & extraout_XMM0_Dc_00;
        local_88._12_4_ = local_88._12_4_ & extraout_XMM0_Dd_00;
        fVar9 = GetColumnOffset(column_index + 1);
        fVar9 = fVar9 - (pIVar5->Style).ColumnsMinSpacing;
        fVar8 = (float)local_88._0_4_;
        if (fVar9 <= (float)local_88._0_4_) {
          fVar8 = fVar9;
        }
      }
      SetColumnOffset(column_index,fVar8);
    }
  }
  (pIVar2->DC).ColumnsCurrent = 0;
  (pIVar2->DC).ColumnsCount = 1;
  (pIVar2->DC).ColumnsFlags = 0;
  (pIVar2->DC).ColumnsSetId = 0;
  ImVector<ImGuiColumnData>::resize(&(pIVar2->DC).ColumnsData,0);
  (pIVar2->DC).ColumnsOffsetX = 0.0;
  (pIVar2->DC).CursorPos.x = (float)(int)((pIVar2->Pos).x + (pIVar2->DC).IndentX + 0.0);
  return;
}

Assistant:

void ImGui::EndColumns()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    IM_ASSERT(window->DC.ColumnsCount > 1);

    PopItemWidth();
    PopClipRect();
    window->DrawList->ChannelsMerge();

    window->DC.ColumnsCellMaxY = ImMax(window->DC.ColumnsCellMaxY, window->DC.CursorPos.y);
    window->DC.CursorPos.y = window->DC.ColumnsCellMaxY;
    window->DC.CursorMaxPos.x = ImMax(window->DC.ColumnsStartMaxPosX, window->DC.ColumnsMaxX);  // Columns don't grow parent

    // Draw columns borders and handle resize
    if (!(window->DC.ColumnsFlags & ImGuiColumnsFlags_NoBorder) && !window->SkipItems)
    {
        const float y1 = window->DC.ColumnsStartPosY;
        const float y2 = window->DC.CursorPos.y;
        int dragging_column = -1;
        for (int i = 1; i < window->DC.ColumnsCount; i++)
        {
            float x = window->Pos.x + GetColumnOffset(i);
            const ImGuiID column_id = window->DC.ColumnsSetId + ImGuiID(i);
            const float column_w = 4.0f; // Width for interaction
            const ImRect column_rect(ImVec2(x - column_w, y1), ImVec2(x + column_w, y2));
            if (IsClippedEx(column_rect, &column_id, false))
                continue;
            
            bool hovered = false, held = false;
            if (!(window->DC.ColumnsFlags & ImGuiColumnsFlags_NoResize))
            {
                ButtonBehavior(column_rect, column_id, &hovered, &held);
                if (hovered || held)
                    g.MouseCursor = ImGuiMouseCursor_ResizeEW;
                if (held && g.ActiveIdIsJustActivated)
                    g.ActiveIdClickOffset.x -= column_w; // Store from center of column line (we used a 8 wide rect for columns clicking). This is used by GetDraggedColumnOffset().
                if (held)
                    dragging_column = i;
            }

            // Draw column
            const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
            const float xi = (float)(int)x;
            window->DrawList->AddLine(ImVec2(xi, y1 + 1.0f), ImVec2(xi, y2), col);
        }

        // Apply dragging after drawing the column lines, so our rendered lines are in sync with how items were displayed during the frame.
        if (dragging_column != -1)
        {
            float x = GetDraggedColumnOffset(dragging_column);
            SetColumnOffset(dragging_column, x);
        }
    }

    window->DC.ColumnsSetId = 0;
    window->DC.ColumnsCurrent = 0;
    window->DC.ColumnsCount = 1;
    window->DC.ColumnsFlags = 0;
    window->DC.ColumnsData.resize(0);
    window->DC.ColumnsOffsetX = 0.0f;
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.IndentX + window->DC.ColumnsOffsetX);
}